

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O2

int state_align_search_finish(ps_search_t *search)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ps_alignment_iter_t *ppVar4;
  ps_alignment_entry_t *ppVar5;
  long lVar6;
  int iVar7;
  int pos;
  int iVar8;
  int iVar9;
  
  lVar6 = (long)*(int *)&search[1].acmod * 0x58;
  pos = *(int *)(search[1].name + lVar6 + -0x24);
  if (pos == -1) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
            ,0xe4,"Failed to reach final state in alignment\n");
    return -1;
  }
  iVar8 = *(int *)(search[1].name + lVar6 + -0x28);
  ppVar4 = ps_alignment_states((ps_alignment_t *)search[1].type);
  iVar9 = *(int *)((long)&search[1].acmod + 4);
  iVar1 = iVar9 + 1;
  do {
    iVar7 = pos;
    iVar3 = iVar9 + 1;
    do {
      iVar9 = iVar3;
      iVar3 = iVar9 + -1;
      if (iVar3 < 1) {
        ppVar4 = ps_alignment_iter_goto(ppVar4,0);
        if (ppVar4 == (ps_alignment_iter_t *)0x0) {
          __assert_fail("itor != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                        ,0xff,"int state_align_search_finish(ps_search_t *)");
        }
        ppVar5 = ps_alignment_iter_get(ppVar4);
        ppVar5->start = 0;
        ppVar5->duration = iVar1;
        ps_alignment_iter_free(ppVar4);
        ps_alignment_propagate((ps_alignment_t *)search[1].type);
        return 0;
      }
      lVar6 = (long)(int)(*(int *)((long)&search[1].dict + 4) * (iVar9 - 2U) + iVar7);
      iVar7 = (&(search[1].d2p)->refcount)[lVar6 * 2];
      if (iVar7 == -1) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                ,0xec,"Alignment failed in frame %d\n",(ulong)(iVar9 - 2U));
        return -1;
      }
    } while (iVar7 == pos);
    iVar2 = *(int *)(&(search[1].d2p)->field_0x4 + lVar6 * 8);
    ppVar4 = ps_alignment_iter_goto(ppVar4,pos);
    if (ppVar4 == (ps_alignment_iter_t *)0x0) {
      __assert_fail("itor != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                    ,0xf2,"int state_align_search_finish(ps_search_t *)");
    }
    iVar9 = iVar9 + -2;
    ppVar5 = ps_alignment_iter_get(ppVar4);
    ppVar5->start = iVar3;
    ppVar5->duration = iVar1 - iVar3;
    ppVar5->score = iVar8 - iVar2;
    pos = iVar7;
    iVar8 = iVar2;
    iVar1 = iVar3;
  } while( true );
}

Assistant:

static int
state_align_search_finish(ps_search_t *search)
{
    state_align_search_t *sas = (state_align_search_t *)search;
    hmm_t *final_phone = sas->hmms + sas->n_phones - 1;
    ps_alignment_iter_t *itor;
    ps_alignment_entry_t *ent;

    int last_frame, cur_frame;
    state_align_hist_t last, cur;

    /* Best state exiting the last cur_frame. */
    last.id = cur.id = hmm_out_history(final_phone);
    last.score = hmm_out_score(final_phone);
    if (last.id == -1) {
        E_ERROR("Failed to reach final state in alignment\n");
        return -1;
    }
    itor = ps_alignment_states(sas->al);
    last_frame = sas->frame + 1;
    for (cur_frame = sas->frame - 1; cur_frame >= 0; --cur_frame) {
	cur = sas->tokens[cur_frame * sas->n_emit_state + cur.id];
        if (cur.id == -1) {
            E_ERROR("Alignment failed in frame %d\n", cur_frame);
            return -1;
        }
        /* State boundary, update alignment entry for next state. */
        if (cur.id != last.id) {
            itor = ps_alignment_iter_goto(itor, last.id);
            assert(itor != NULL);
            ent = ps_alignment_iter_get(itor);
            ent->start = cur_frame + 1;
            ent->duration = last_frame - ent->start;
            ent->score =  last.score - cur.score;
            E_DEBUG("state %d start %d end %d\n", last.id,
                    ent->start, last_frame);
    	    last = cur;
            last_frame = cur_frame + 1;
        }
    }
    /* Update alignment entry for initial state. */
    itor = ps_alignment_iter_goto(itor, 0);
    assert(itor != NULL);
    ent = ps_alignment_iter_get(itor);
    ent->start = 0;
    ent->duration = last_frame;
    E_DEBUG("state %d start %d end %d\n", 0,
            ent->start, last_frame);
    ps_alignment_iter_free(itor);
    ps_alignment_propagate(sas->al);

    return 0;
}